

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void exprSetHeight(Expr *p)

{
  int iVar1;
  int iVar2;
  Select *pSelect;
  uint uVar3;
  long lVar4;
  ExprList **ppEVar5;
  int local_14;
  
  if (p->pLeft == (Expr *)0x0) {
    local_14 = 0;
  }
  else {
    local_14 = p->pLeft->nHeight;
  }
  if ((p->pRight != (Expr *)0x0) && (iVar1 = p->pRight->nHeight, local_14 < iVar1)) {
    local_14 = iVar1;
  }
  pSelect = (Select *)(p->x).pList;
  if ((p->flags >> 0xc & 1) == 0) {
    if (pSelect != (Select *)0x0) {
      iVar1._0_1_ = pSelect->op;
      iVar1._1_1_ = pSelect->field_0x1;
      iVar1._2_2_ = pSelect->nSelectRow;
      if ((long)iVar1 < 1) {
        uVar3 = 0;
      }
      else {
        lVar4 = 0;
        ppEVar5 = (ExprList **)&pSelect->iLimit;
        do {
          if ((*ppEVar5 != (ExprList *)0x0) &&
             (iVar2 = *(int *)&(*ppEVar5)[1].a[0].pExpr, local_14 < iVar2)) {
            local_14 = iVar2;
          }
          lVar4 = lVar4 + 1;
          ppEVar5 = ppEVar5 + 3;
        } while (lVar4 < iVar1);
        lVar4 = 0;
        uVar3 = 0;
        do {
          uVar3 = uVar3 | *(uint *)(*(long *)((long)&pSelect->iLimit + lVar4) + 4);
          lVar4 = lVar4 + 0x18;
        } while ((long)iVar1 * 0x18 != lVar4);
        uVar3 = uVar3 & 0x400208;
      }
      p->flags = uVar3 | p->flags;
    }
  }
  else {
    heightOfSelect(pSelect,&local_14);
  }
  p->nHeight = local_14 + 1;
  return;
}

Assistant:

static void exprSetHeight(Expr *p){
  int nHeight = p->pLeft ? p->pLeft->nHeight : 0;
  if( p->pRight && p->pRight->nHeight>nHeight ) nHeight = p->pRight->nHeight;
  if( ExprUseXSelect(p) ){
    heightOfSelect(p->x.pSelect, &nHeight);
  }else if( p->x.pList ){
    heightOfExprList(p->x.pList, &nHeight);
    p->flags |= EP_Propagate & sqlite3ExprListFlags(p->x.pList);
  }
  p->nHeight = nHeight + 1;
}